

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multithread.cpp
# Opt level: O1

void indk::ComputeBackendMultithread::tWorker(void *object)

{
  Neuron *this;
  pair<float,_float> pVar1;
  unique_lock *puVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint _DimensionsCount;
  Position *this_00;
  Position *this_01;
  Position *this_02;
  int64_t iVar6;
  Entry *pEVar7;
  Receptor *this_03;
  Position *P;
  Synapse *this_04;
  Position *this_05;
  long lVar8;
  ulong uVar9;
  int j;
  float fVar10;
  float fVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  vector<long,_std::allocator<long>_> times;
  int i;
  int j_1;
  unique_lock<std::mutex> lk;
  float local_d8;
  float local_d4;
  int local_c4;
  vector<long,_std::allocator<long>_> local_b8;
  ulong local_a0;
  float local_94;
  int64_t local_90;
  long local_88;
  long local_80;
  unique_lock<std::mutex> local_78;
  undefined1 local_68 [16];
  unique_lock *local_58;
  mutex_type *local_50;
  int64_t local_48;
  ulong local_40;
  long local_38;
  
  local_50 = (mutex_type *)((long)object + 0x30);
  local_58 = (unique_lock *)((long)object + 0x58);
  do {
    puVar2 = local_58;
    local_78._M_owns = false;
    local_78._M_device = local_50;
    std::unique_lock<std::mutex>::lock(&local_78);
    local_78._M_owns = true;
    std::condition_variable::wait(puVar2);
    this_00 = (Position *)operator_new(0x10);
    Position::Position(this_00,0,3);
    this_01 = (Position *)operator_new(0x10);
    Position::Position(this_01,0,3);
    this_02 = (Position *)operator_new(0x10);
    Position::Position(this_02,0,3);
    local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (long *)0x0;
    local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (long *)0x0;
    lVar8 = *(long *)((long)object + 8) - *object;
    if (lVar8 != 0) {
      uVar9 = lVar8 >> 3;
      local_c4 = 0;
      do {
        local_40 = uVar9 + (uVar9 == 0);
        uVar9 = 0;
        do {
          local_a0 = uVar9;
          if ((ulong)((long)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3) <= uVar9) {
            local_38 = 0;
            if (local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                        (&local_b8,
                         (iterator)
                         local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_38);
            }
            else {
              *local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish = 0;
              local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          this = *(Neuron **)(*object + local_a0 * 8);
          iVar6 = local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_start[local_a0];
          local_90 = Neuron::getSignalBufferSize(this);
          if (iVar6 < local_90) {
            iVar4 = Neuron::getState(this,iVar6);
            local_48 = iVar6;
            if (iVar4 == 1) {
              uVar5 = Neuron::getXm(this);
              _DimensionsCount = Neuron::getDimensionsCount(this);
              Position::setXm(this_00,uVar5);
              Position::setDimensionsCount(this_00,_DimensionsCount);
              Position::setXm(this_01,uVar5);
              Position::setDimensionsCount(this_01,_DimensionsCount);
              Position::setXm(this_02,uVar5);
              Position::setDimensionsCount(this_02,_DimensionsCount);
              lVar8 = 0;
              while( true ) {
                iVar6 = Neuron::getEntriesCount(this);
                if (iVar6 <= lVar8) break;
                pEVar7 = Neuron::getEntry(this,lVar8);
                Neuron::Entry::doProcess(pEVar7);
                lVar8 = lVar8 + 1;
              }
              local_d8 = 0.0;
              local_88 = 0;
              while( true ) {
                iVar6 = Neuron::getReceptorsCount(this);
                if (iVar6 <= local_88) break;
                this_03 = Neuron::getReceptor(this,local_88);
                bVar3 = Neuron::Receptor::isLocked(this_03);
                if (bVar3) {
                  P = Neuron::Receptor::getPosf(this_03);
                }
                else {
                  P = Neuron::Receptor::getPos(this_03);
                }
                Position::doZeroPosition(this_01);
                local_d4 = 0.0;
                local_80 = 0;
                while( true ) {
                  iVar6 = Neuron::getEntriesCount(this);
                  if (iVar6 <= local_80) break;
                  pEVar7 = Neuron::getEntry(this,local_80);
                  uVar5 = 0;
                  while( true ) {
                    iVar6 = Neuron::Entry::getSynapsesCount(pEVar7);
                    if (iVar6 <= (long)(ulong)uVar5) break;
                    this_04 = Neuron::Entry::getSynapse(pEVar7,(ulong)uVar5);
                    this_05 = Neuron::Synapse::getPos(this_04);
                    fVar10 = Position::getDistanceFrom(this_05,P);
                    fVar11 = Neuron::Synapse::getLambda(this_04);
                    local_68._0_4_ = fVar11;
                    local_94 = Neuron::Synapse::getGamma(this_04);
                    fVar11 = Neuron::Synapse::getdGamma(this_04);
                    pVar1 = Computer::getFiFunctionValue
                                      ((float)local_68._0_4_,local_94,fVar11,fVar10);
                    local_68._8_4_ = extraout_XMM0_Dc;
                    local_68._0_4_ = pVar1.first;
                    local_68._4_4_ = pVar1.second;
                    local_68._12_4_ = extraout_XMM0_Dd;
                    if (0.0 < pVar1.second) {
                      fVar11 = Computer::getFiVectorLength(pVar1.second);
                      Computer::getNewPosition(this_02,P,this_05,fVar11,fVar10);
                      Position::doAdd(this_01,this_02);
                    }
                    local_d4 = local_d4 + (float)local_68._0_4_;
                    uVar5 = uVar5 + 1;
                  }
                  local_80 = local_80 + 1;
                }
                Neuron::Receptor::setFi(this_03,local_d4);
                Neuron::Receptor::doUpdatePos(this_03,this_01);
                bVar3 = Neuron::Receptor::doCheckActive(this_03);
                fVar10 = Neuron::Receptor::getdFi(this_03);
                fVar10 = Computer::getReceptorInfluenceValue(bVar3,fVar10,this_01,this_00);
                Neuron::Receptor::doUpdateSensitivityValue(this_03);
                local_d8 = local_d8 + fVar10;
                local_88 = local_88 + 1;
              }
              iVar6 = Neuron::getReceptorsCount(this);
              Neuron::doFinalizeInput(this,local_d8 / (float)iVar6);
              local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start[local_a0] = local_48 + 1;
              local_c4 = local_c4 + (uint)(local_90 <= local_48 + 1);
            }
          }
          uVar9 = local_a0 + 1;
        } while (uVar9 != local_40);
        uVar9 = *(long *)((long)object + 8) - *object >> 3;
      } while ((ulong)(long)local_c4 < uVar9);
    }
    Position::~Position(this_00);
    operator_delete(this_00,0x10);
    Position::~Position(this_02);
    operator_delete(this_02,0x10);
    Position::~Position(this_01);
    operator_delete(this_01,0x10);
    LOCK();
    *(undefined1 *)((long)object + 0x28) = 1;
    UNLOCK();
    Event::doNotifyOne(*(Event **)((long)object + 0x20));
    if (local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_78);
  } while( true );
}

Assistant:

[[noreturn]] void indk::ComputeBackendMultithread::tWorker(void* object) {
    auto worker = (indk::Worker*)object;

    while (true) {
        std::unique_lock<std::mutex> lk(worker->m);
        worker -> cv.wait(lk);

        auto zPos = new indk::Position(0, 3);
        auto dRPos = new indk::Position(0, 3);
        auto nRPos = new indk::Position(0, 3);

        std::vector<int64_t> times;
        int tdone = 0;
        uint64_t size = worker -> objects.size();
        while (tdone < size) {
            for (uint64_t n = 0; n < size; n++) {
                if (n >= times.size()) times.push_back(0);
                auto N = (indk::Neuron*)worker -> objects[n];
                auto t = times[n];
                auto ComputeSize = N -> getSignalBufferSize();

                if (t >= ComputeSize) continue;

                if (N->getState(t) != indk::Neuron::States::Pending) {
                    continue;
                }

                float FiSum, D, P = 0;
                auto Xm = N -> getXm();
                auto DimensionsCount = N -> getDimensionsCount();

                zPos -> setXm(Xm);
                zPos -> setDimensionsCount(DimensionsCount);
                dRPos -> setXm(Xm);
                dRPos -> setDimensionsCount(DimensionsCount);
                nRPos -> setXm(Xm);
                nRPos -> setDimensionsCount(DimensionsCount);

                indk::Position *RPos;

                for (int j = 0; j < N->getEntriesCount(); j++) {
                    auto E = N -> getEntry(j);
                    E -> doProcess();
                }

                for (int i = 0; i < N->getReceptorsCount(); i++) {
                    auto R = N->getReceptor(i);
                    if (!R->isLocked()) RPos = R -> getPos();
                    else RPos = R -> getPosf();
                    indk::Position *SPos;
                    std::pair<float, float> FiValues;
                    FiSum = 0;
                    dRPos -> doZeroPosition();

                    for (int j = 0; j < N->getEntriesCount(); j++) {
                        auto E = N -> getEntry(j);

                        for (unsigned int k = 0; k < E->getSynapsesCount(); k++) {
                            auto *S = E -> getSynapse(k);
                            SPos = S -> getPos();
                            D = SPos -> getDistanceFrom(RPos);
                            FiValues = indk::Computer::getFiFunctionValue(S->getLambda(), S->getGamma(), S->getdGamma(), D);
                            if (FiValues.second > 0) {
                                indk::Computer::getNewPosition(nRPos, RPos, SPos, indk::Computer::getFiVectorLength(FiValues.second), D);
                                dRPos -> doAdd(nRPos);
                            }
                            FiSum += FiValues.first;
                        }
                    }

                    R -> setFi(FiSum);
                    R -> doUpdatePos(dRPos);
                    P += indk::Computer::getReceptorInfluenceValue(R->doCheckActive(), R->getdFi(), dRPos, zPos);
                    R -> doUpdateSensitivityValue();
                }
                P /= (float)N->getReceptorsCount();

                N -> doFinalizeInput(P);
                t++;
                times[n] = t;
                if (t >= ComputeSize) {
                    tdone++;
                }
            }
            size = worker -> objects.size();
        }

        delete zPos;
        delete nRPos;
        delete dRPos;

        worker -> done.store(true);
        ((indk::Event*)worker->event) -> doNotifyOne();
    }
}